

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

void __thiscall QTabBarPrivate::closeTab(QTabBarPrivate *this)

{
  int iVar1;
  QTabBar *pQVar2;
  QWidget *pQVar3;
  QStyle *pQVar4;
  long i_00;
  qsizetype qVar5;
  const_reference ppTVar6;
  QTabBarPrivate *in_RDI;
  int i;
  ButtonPosition closeSide;
  int tabToClose;
  QObject *object;
  QTabBar *q;
  QWidget *in_stack_ffffffffffffffc8;
  int local_24;
  int local_1c;
  
  pQVar2 = q_func(in_RDI);
  pQVar3 = (QWidget *)QObject::sender();
  local_1c = -1;
  pQVar4 = QWidget::style(in_stack_ffffffffffffffc8);
  iVar1 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x5c,0,pQVar2);
  local_24 = 0;
  do {
    i_00 = (long)local_24;
    qVar5 = QList<QTabBarPrivate::Tab_*>::size(&in_RDI->tabList);
    if (qVar5 <= i_00) {
LAB_006ac011:
      if (local_1c != -1) {
        QTabBar::tabCloseRequested((QTabBar *)0x6ac026,(int)((ulong)i_00 >> 0x20));
      }
      return;
    }
    if (iVar1 == 0) {
      ppTVar6 = QList<QTabBarPrivate::Tab_*>::at((QList<QTabBarPrivate::Tab_*> *)in_RDI,i_00);
      if ((*ppTVar6)->leftWidget == pQVar3) {
        local_1c = local_24;
        goto LAB_006ac011;
      }
    }
    else {
      ppTVar6 = QList<QTabBarPrivate::Tab_*>::at((QList<QTabBarPrivate::Tab_*> *)in_RDI,i_00);
      if ((*ppTVar6)->rightWidget == pQVar3) {
        local_1c = local_24;
        goto LAB_006ac011;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void QTabBarPrivate::closeTab()
{
    Q_Q(QTabBar);
    QObject *object = q->sender();
    int tabToClose = -1;
    QTabBar::ButtonPosition closeSide = (QTabBar::ButtonPosition)q->style()->styleHint(QStyle::SH_TabBar_CloseButtonPosition, nullptr, q);
    for (int i = 0; i < tabList.size(); ++i) {
        if (closeSide == QTabBar::LeftSide) {
            if (tabList.at(i)->leftWidget == object) {
                tabToClose = i;
                break;
            }
        } else {
            if (tabList.at(i)->rightWidget == object) {
                tabToClose = i;
                break;
            }
        }
    }
    if (tabToClose != -1)
        emit q->tabCloseRequested(tabToClose);
}